

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UBool ucnv_canCreateConverter_63(char *converterName,UErrorCode *err)

{
  UBool UVar1;
  UConverterSharedData *mySharedConverterData_00;
  UConverterSharedData *mySharedConverterData;
  UConverterLoadArgs stackArgs;
  UConverterNamePieces stackPieces;
  UConverter myUConverter;
  UErrorCode *err_local;
  char *converterName_local;
  
  memset(&mySharedConverterData,0,0x28);
  mySharedConverterData._0_4_ = 0x28;
  UVar1 = U_SUCCESS(*err);
  if (UVar1 != '\0') {
    stackArgs.size._0_1_ = 1;
    mySharedConverterData_00 =
         ucnv_loadSharedData_63
                   (converterName,(UConverterNamePieces *)&stackArgs.locale,
                    (UConverterLoadArgs *)&mySharedConverterData,err);
    ucnv_createConverterFromSharedData_63
              ((UConverter *)(stackPieces.locale + 0x9c),mySharedConverterData_00,
               (UConverterLoadArgs *)&mySharedConverterData,err);
    ucnv_unloadSharedDataIfReady_63(mySharedConverterData_00);
  }
  UVar1 = U_SUCCESS(*err);
  return UVar1;
}

Assistant:

U_CFUNC UBool
ucnv_canCreateConverter(const char *converterName, UErrorCode *err) {
    UConverter myUConverter;
    UConverterNamePieces stackPieces;
    UConverterLoadArgs stackArgs=UCNV_LOAD_ARGS_INITIALIZER;
    UConverterSharedData *mySharedConverterData;

    UTRACE_ENTRY_OC(UTRACE_UCNV_OPEN);

    if(U_SUCCESS(*err)) {
        UTRACE_DATA1(UTRACE_OPEN_CLOSE, "test if can open converter %s", converterName);

        stackArgs.onlyTestIsLoadable=TRUE;
        mySharedConverterData = ucnv_loadSharedData(converterName, &stackPieces, &stackArgs, err);
        ucnv_createConverterFromSharedData(
            &myUConverter, mySharedConverterData,
            &stackArgs,
            err);
        ucnv_unloadSharedDataIfReady(mySharedConverterData);
    }

    UTRACE_EXIT_STATUS(*err);
    return U_SUCCESS(*err);
}